

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O3

void __thiscall spv::Builder::postProcess(Builder *this,Instruction *inst)

{
  _Rb_tree_header *p_Var1;
  Op OVar2;
  int *piVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  Id IVar7;
  int iVar8;
  uint uVar9;
  _Rb_tree_node_base *p_Var10;
  undefined4 extraout_var;
  pointer ppIVar11;
  uint idx;
  Instruction *pIVar12;
  ulong uVar13;
  Instruction *pIVar14;
  uint local_54;
  Capability local_50;
  int local_4c;
  ulong local_48;
  pointer local_40;
  Instruction *local_38;
  
  OVar2 = inst->opCode;
  if ((int)OVar2 < 0xd2) {
    if (OVar2 - OpImageQuerySizeLod < 5) {
      local_50 = CapabilityImageQuery;
    }
    else {
      if (OVar2 - OpLoad < 2) {
        if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0) {
LAB_00468d94:
          __assert_fail("idOperand[op]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                        ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
        }
        ppIVar11 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pIVar14 = ppIVar11[*(inst->operands).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start];
        if (pIVar14->opCode == OpAccessChain) {
          if ((*(pIVar14->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0)
          goto LAB_00468d94;
          pIVar12 = ppIVar11[ppIVar11[*(pIVar14->operands).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start]->typeId];
          if (pIVar12->opCode != OpTypePointer) {
            __assert_fail("type->getOpCode() == OpTypePointer",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                          ,0xff,"void spv::Builder::postProcess(Instruction &)");
          }
          uVar13 = **(ulong **)
                     &(pIVar12->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data;
          if ((uVar13 & 1) != 0) goto LAB_00468db3;
          piVar3 = *(int **)&(pIVar12->operands).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data;
          if (*piVar3 == 0x14e5) {
            if ((uVar13 & 2) == 0) goto LAB_00468d94;
            uVar13 = (ulong)(uint)piVar3[1];
            pIVar12 = ppIVar11[uVar13];
            iVar6 = Instruction::getNumOperands(pIVar14);
            local_54 = 0;
            if (1 < iVar6) {
              p_Var1 = &(this->decorations)._M_t._M_impl.super__Rb_tree_header;
              local_54 = 0;
              iVar6 = 1;
              local_38 = pIVar14;
              do {
                local_4c = iVar6;
                IVar7 = Instruction::getIdOperand(pIVar14,iVar6);
                local_40 = (this->module).idToInstruction.
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                if (pIVar12->opCode - OpTypeArray < 2) {
                  for (p_Var10 = (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left; (_Rb_tree_header *)p_Var10 != p_Var1;
                      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
                    lVar4 = *(long *)(p_Var10 + 1);
                    if (*(int *)(lVar4 + 0x10) == 0x47) {
                      uVar5 = **(ulong **)(lVar4 + 0x30);
                      if ((uVar5 & 1) == 0) goto LAB_00468d94;
                      piVar3 = *(int **)(lVar4 + 0x18);
                      if (*piVar3 == (int)uVar13) {
                        if ((uVar5 & 2) != 0) goto LAB_00468db3;
                        if (piVar3[1] == 6) {
                          if ((uVar5 & 4) != 0) goto LAB_00468db3;
                          local_54 = local_54 | piVar3[2];
                        }
                      }
                    }
                  }
                  if ((*(pIVar12->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) == 0)
                  goto LAB_00468d94;
                  local_48 = (ulong)*(pIVar12->operands).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                  ppIVar11 = local_40 + local_48;
                }
                else {
                  if (pIVar12->opCode != OpTypeStruct) break;
                  pIVar14 = local_40[IVar7];
                  if (pIVar14->opCode != OpConstant) {
                    __assert_fail("idx->getOpCode() == OpConstant",
                                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                                  ,0x10e,"void spv::Builder::postProcess(Instruction &)");
                  }
                  if ((**(byte **)&(pIVar14->idOperand).super__Bvector_base<std::allocator<bool>_>.
                                   _M_impl.super__Bvector_impl_data & 1) != 0) goto LAB_00468db3;
                  iVar6 = **(int **)&(pIVar14->operands).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data;
                  for (p_Var10 = (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left; (_Rb_tree_header *)p_Var10 != p_Var1;
                      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
                    lVar4 = *(long *)(p_Var10 + 1);
                    if (*(int *)(lVar4 + 0x10) == 0x48) {
                      uVar5 = **(ulong **)(lVar4 + 0x30);
                      if ((uVar5 & 1) == 0) goto LAB_00468d94;
                      piVar3 = *(int **)(lVar4 + 0x18);
                      if (*piVar3 == (int)uVar13) {
                        if ((uVar5 & 2) != 0) goto LAB_00468db3;
                        if (piVar3[1] == iVar6) {
                          if ((uVar5 & 4) != 0) goto LAB_00468db3;
                          if ((piVar3[2] == 0x23) || (piVar3[2] == 7)) {
                            if ((uVar5 & 8) != 0) goto LAB_00468db3;
                            local_54 = local_54 | piVar3[3];
                          }
                        }
                      }
                    }
                  }
                  IVar7 = Instruction::getIdOperand(pIVar12,iVar6);
                  local_48 = CONCAT44(extraout_var,IVar7);
                  ppIVar11 = (this->module).idToInstruction.
                             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                             ._M_impl.super__Vector_impl_data._M_start + IVar7;
                }
                pIVar14 = local_38;
                pIVar12 = *ppIVar11;
                iVar6 = local_4c + 1;
                iVar8 = Instruction::getNumOperands(local_38);
                uVar13 = local_48;
              } while (iVar6 < iVar8);
            }
            iVar6 = Instruction::getNumOperands(inst);
            if (iVar6 < 3) {
              __assert_fail("inst.getNumOperands() >= 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                            ,0x130,"void spv::Builder::postProcess(Instruction &)");
            }
            uVar9 = Instruction::getImmediateOperand(inst,(inst->opCode == OpStore) + 1);
            if ((uVar9 & 2) == 0) {
              __assert_fail("memoryAccess & MemoryAccessAlignedMask",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                            ,0x132,"void spv::Builder::postProcess(Instruction &)");
            }
            idx = inst->opCode == OpStore | 2;
            uVar9 = Instruction::getImmediateOperand(inst,idx);
            Instruction::setImmediateOperand(inst,idx,-(local_54 | uVar9) & (local_54 | uVar9));
          }
        }
        goto LAB_004689dd;
      }
      if (OVar2 != OpExtInst) goto LAB_004689dd;
      if ((*(inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 2) != 0) {
LAB_00468db3:
        __assert_fail("!idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
      }
      if (2 < (inst->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[1] - 0x4c) goto LAB_004689dd;
      local_50 = CapabilityInterpolationFunction;
    }
  }
  else if (OVar2 - OpDPdxFine < 6) {
    local_50 = CapabilityDerivativeControl;
  }
  else {
    if (OVar2 != OpGroupNonUniformPartitionNV) goto LAB_004689dd;
    addExtension(this,"SPV_NV_shader_subgroup_partitioned");
    local_50 = CapabilityGroupNonUniformPartitionedNV;
  }
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
              *)&this->capabilities,&local_50);
LAB_004689dd:
  if (inst->typeId != 0) {
    postProcessType(this,inst,inst->typeId);
  }
  iVar6 = Instruction::getNumOperands(inst);
  if (0 < iVar6) {
    uVar13 = 0;
    do {
      iVar6 = (int)uVar13;
      if (((inst->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >>
           (uVar13 & 0x3f) & 1) != 0) {
        IVar7 = Instruction::getIdOperand(inst,iVar6);
        pIVar14 = (this->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[IVar7];
        if ((pIVar14 != (Instruction *)0x0) && (pIVar14->typeId != 0)) {
          IVar7 = Instruction::getIdOperand(inst,iVar6);
          pIVar14 = (this->module).idToInstruction.
                    super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[IVar7];
          if (pIVar14 == (Instruction *)0x0) {
            IVar7 = 0;
          }
          else {
            IVar7 = pIVar14->typeId;
          }
          postProcessType(this,inst,IVar7);
        }
      }
      uVar13 = (ulong)(iVar6 + 1U);
      iVar8 = Instruction::getNumOperands(inst);
    } while ((int)(iVar6 + 1U) < iVar8);
  }
  return;
}

Assistant:

void Builder::postProcess(Instruction& inst)
{
    // Add capabilities based simply on the opcode.
    switch (inst.getOpCode()) {
    case OpExtInst:
        switch (inst.getImmediateOperand(1)) {
        case GLSLstd450InterpolateAtCentroid:
        case GLSLstd450InterpolateAtSample:
        case GLSLstd450InterpolateAtOffset:
            addCapability(CapabilityInterpolationFunction);
            break;
        default:
            break;
        }
        break;
    case OpDPdxFine:
    case OpDPdyFine:
    case OpFwidthFine:
    case OpDPdxCoarse:
    case OpDPdyCoarse:
    case OpFwidthCoarse:
        addCapability(CapabilityDerivativeControl);
        break;

    case OpImageQueryLod:
    case OpImageQuerySize:
    case OpImageQuerySizeLod:
    case OpImageQuerySamples:
    case OpImageQueryLevels:
        addCapability(CapabilityImageQuery);
        break;

    case OpGroupNonUniformPartitionNV:
        addExtension(E_SPV_NV_shader_subgroup_partitioned);
        addCapability(CapabilityGroupNonUniformPartitionedNV);
        break;

    case OpLoad:
    case OpStore:
        {
            // For any load/store to a PhysicalStorageBufferEXT, walk the accesschain
            // index list to compute the misalignment. The pre-existing alignment value
            // (set via Builder::AccessChain::alignment) only accounts for the base of
            // the reference type and any scalar component selection in the accesschain,
            // and this function computes the rest from the SPIR-V Offset decorations.
            Instruction *accessChain = module.getInstruction(inst.getIdOperand(0));
            if (accessChain->getOpCode() == OpAccessChain) {
                Instruction *base = module.getInstruction(accessChain->getIdOperand(0));
                // Get the type of the base of the access chain. It must be a pointer type.
                Id typeId = base->getTypeId();
                Instruction *type = module.getInstruction(typeId);
                assert(type->getOpCode() == OpTypePointer);
                if (type->getImmediateOperand(0) != StorageClassPhysicalStorageBufferEXT) {
                    break;
                }
                // Get the pointee type.
                typeId = type->getIdOperand(1);
                type = module.getInstruction(typeId);
                // Walk the index list for the access chain. For each index, find any
                // misalignment that can apply when accessing the member/element via
                // Offset/ArrayStride/MatrixStride decorations, and bitwise OR them all
                // together.
                int alignment = 0;
                for (int i = 1; i < accessChain->getNumOperands(); ++i) {
                    Instruction *idx = module.getInstruction(accessChain->getIdOperand(i));
                    if (type->getOpCode() == OpTypeStruct) {
                        assert(idx->getOpCode() == OpConstant);
                        unsigned int c = idx->getImmediateOperand(0);

                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpMemberDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == c &&
                                (decoration.get()->getImmediateOperand(2) == DecorationOffset ||
                                 decoration.get()->getImmediateOperand(2) == DecorationMatrixStride)) {
                                alignment |= decoration.get()->getImmediateOperand(3);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // get the next member type
                        typeId = type->getIdOperand(c);
                        type = module.getInstruction(typeId);
                    } else if (type->getOpCode() == OpTypeArray ||
                               type->getOpCode() == OpTypeRuntimeArray) {
                        const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                            if (decoration.get()->getOpCode() == OpDecorate &&
                                decoration.get()->getIdOperand(0) == typeId &&
                                decoration.get()->getImmediateOperand(1) == DecorationArrayStride) {
                                alignment |= decoration.get()->getImmediateOperand(2);
                            }
                        };
                        std::for_each(decorations.begin(), decorations.end(), function);
                        // Get the element type
                        typeId = type->getIdOperand(0);
                        type = module.getInstruction(typeId);
                    } else {
                        // Once we get to any non-aggregate type, we're done.
                        break;
                    }
                }
                assert(inst.getNumOperands() >= 3);
                unsigned int memoryAccess = inst.getImmediateOperand((inst.getOpCode() == OpStore) ? 2 : 1);
                assert(memoryAccess & MemoryAccessAlignedMask);
                static_cast<void>(memoryAccess);
                // Compute the index of the alignment operand.
                int alignmentIdx = 2;
                if (inst.getOpCode() == OpStore)
                    alignmentIdx++;
                // Merge new and old (mis)alignment
                alignment |= inst.getImmediateOperand(alignmentIdx);
                // Pick the LSB
                alignment = alignment & ~(alignment & (alignment-1));
                // update the Aligned operand
                inst.setImmediateOperand(alignmentIdx, alignment);
            }
            break;
        }

    default:
        break;
    }

    // Checks based on type
    if (inst.getTypeId() != NoType)
        postProcessType(inst, inst.getTypeId());
    for (int op = 0; op < inst.getNumOperands(); ++op) {
        if (inst.isIdOperand(op)) {
            // In blocks, these are always result ids, but we are relying on
            // getTypeId() to return NoType for things like OpLabel.
            if (getTypeId(inst.getIdOperand(op)) != NoType)
                postProcessType(inst, getTypeId(inst.getIdOperand(op)));
        }
    }
}